

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

string * __thiscall
soul::ResolutionPass::FunctionResolver::findPossibleMisspeltFunction
          (string *__return_storage_ptr__,FunctionResolver *this,string *name)

{
  ModuleBase *pMVar1;
  int iVar2;
  undefined4 extraout_var;
  Scope *scope;
  size_t lowestDistance;
  string nearest;
  size_t local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  undefined4 extraout_var_00;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_a0 = 5;
  pMVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).module;
  scope = &pMVar1->super_Scope;
  if (pMVar1 == (ModuleBase *)0x0) {
    scope = (Scope *)0x0;
  }
  while( true ) {
    iVar2 = (*scope->_vptr_Scope[4])(scope);
    if (CONCAT44(extraout_var,iVar2) == 0) break;
    iVar2 = (*scope->_vptr_Scope[4])(scope);
    scope = (Scope *)CONCAT44(extraout_var_00,iVar2);
  }
  findLeastMisspeltFunction(scope,name,&local_98,&local_a0);
  std::__cxx11::string::string((string *)&local_58,(string *)&local_98);
  Program::stripRootNamespaceFromQualifiedPath(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"soul::intrinsics",(allocator<char> *)&local_38);
  TokenisedPathString::removeTopLevelNameIfPresent(__return_storage_ptr__,&local_98,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string findPossibleMisspeltFunction (const std::string& name)
        {
            std::string nearest;
            size_t lowestDistance = 5;

            AST::Scope* topLevelScope = std::addressof (module);

            while (topLevelScope->getParentScope() != nullptr)
                topLevelScope = topLevelScope->getParentScope();

            findLeastMisspeltFunction (*topLevelScope, name, nearest, lowestDistance);

            nearest = Program::stripRootNamespaceFromQualifiedPath (nearest);
            return TokenisedPathString::removeTopLevelNameIfPresent (nearest, getIntrinsicsNamespaceName());
        }